

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRResampler.cpp
# Opt level: O3

void __thiscall
SRCTools::FIRResampler::Constants::Constants
          (Constants *this,uint upsampleFactor,double downsampleFactor,FIRCoefficient *kernel,
          uint kernelLength)

{
  ulong __n;
  uint uVar1;
  FIRCoefficient *__dest;
  FloatSample (*__s) [2];
  uint uVar2;
  FloatSample *pFVar3;
  double dVar4;
  
  dVar4 = floor(downsampleFactor);
  this->usePhaseInterpolation = dVar4 != downsampleFactor;
  __n = (ulong)kernelLength * 4;
  __dest = (FIRCoefficient *)operator_new__(__n);
  memcpy(__dest,kernel,__n);
  this->taps = __dest;
  this->numberOfTaps = kernelLength;
  this->numberOfPhases = upsampleFactor;
  this->phaseIncrement = downsampleFactor;
  dVar4 = ceil((double)kernelLength / (double)upsampleFactor);
  uVar1 = 2;
  do {
    uVar2 = uVar1;
    uVar1 = uVar2 * 2;
  } while (uVar2 < (uint)(long)dVar4);
  this->delayLineMask = uVar2 - 1;
  __s = (FloatSample (*) [2])operator_new__((ulong)uVar2 * 8);
  this->ringBuffer = __s;
  if (uVar2 == 0) {
    return;
  }
  pFVar3 = *__s + 1;
  if (*__s + 1 < __s + uVar2) {
    pFVar3 = __s[uVar2];
  }
  memset(__s,0,((long)pFVar3 + ~(ulong)__s & 0xfffffffffffffffc) + 4);
  return;
}

Assistant:

FIRResampler::Constants::Constants(const unsigned int upsampleFactor, const double downsampleFactor, const FIRCoefficient kernel[], const unsigned int kernelLength) {
	usePhaseInterpolation = downsampleFactor != floor(downsampleFactor);
	FIRCoefficient *kernelCopy = new FIRCoefficient[kernelLength];
	memcpy(kernelCopy, kernel, kernelLength * sizeof(FIRCoefficient));
	taps = kernelCopy;
	numberOfTaps = kernelLength;
	numberOfPhases = upsampleFactor;
	phaseIncrement = downsampleFactor;
	unsigned int minDelayLineLength = static_cast<unsigned int>(ceil(double(kernelLength) / upsampleFactor));
	unsigned int delayLineLength = 2;
	while (delayLineLength < minDelayLineLength) delayLineLength <<= 1;
	delayLineMask = delayLineLength - 1;
	ringBuffer = new FloatSample[delayLineLength][FIR_INTERPOLATOR_CHANNEL_COUNT];
	FloatSample *s = *ringBuffer;
	FloatSample *e = ringBuffer[delayLineLength];
	while (s < e) *(s++) = 0;
}